

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O2

err_t btokSMRespUnwrap(apdu_resp_t *resp,size_t *size,octet *apdu,size_t count,void *state)

{
  void *pvVar1;
  bool_t bVar2;
  size_t count_00;
  size_t sVar3;
  ulong local_68;
  size_t *local_60;
  octet *rdf;
  octet *local_50;
  size_t local_48;
  void *local_40;
  octet *mac;
  
  if (count < 2) {
    return 0x138;
  }
  if (count < 0xc && state != (void *)0x0) {
    return 0x138;
  }
  local_60 = size;
  if (state == (void *)0x0) {
    local_68 = apduRespDec(resp,apdu,count);
    if (local_68 == 0xffffffffffffffff) {
      return 0x138;
    }
    if (local_60 == (size_t *)0x0) {
      return 0;
    }
  }
  else {
    local_48 = count - 2;
    count_00 = derDec2(&rdf,&local_68,apdu,local_48,0x87);
    if (count_00 == 0xffffffffffffffff) {
      local_68 = 0;
      count_00 = 0;
    }
    else {
      if (local_68 < 2) {
        return 0x138;
      }
      if (*rdf != '\x02') {
        return 0x138;
      }
      rdf = rdf + 1;
      local_68 = local_68 - 1;
    }
    sVar3 = derDec3(&mac,apdu + count_00,local_48 - count_00,0x8e,8);
    if (sVar3 == 0xffffffffffffffff) {
      return 0x138;
    }
    if (sVar3 + count_00 + 2 != count) {
      return 0x138;
    }
    if (resp == (apdu_resp_t *)0x0) {
      if (local_60 == (size_t *)0x0) {
        return 0;
      }
      local_68 = local_68 + 0x10;
    }
    else {
      if ((*(byte *)((long)state + 0x40) & 1) != 0) {
        return 0x205;
      }
      local_50 = (octet *)((long)state + 0x40);
      pvVar1 = (void *)((long)state + 0x50);
      beltMACStart(pvVar1,(octet *)state,0x20);
      beltMACStepA(local_50,0x10,pvVar1);
      beltMACStepA(apdu,count_00,pvVar1);
      beltMACStepA(apdu + (count - 2),2,pvVar1);
      bVar2 = beltMACStepV(mac,pvVar1);
      if (bVar2 == 0) {
        return 0x1ff;
      }
      local_40 = pvVar1;
      memSet(resp,'\0',0x10);
      resp->sw1 = apdu[local_48];
      resp->sw2 = apdu[count - 1];
      resp->rdf_len = local_68;
      memCopy(resp + 1,rdf,local_68);
      pvVar1 = local_40;
      if (local_68 != 0) {
        beltCFBStart(local_40,(octet *)((long)state + 0x20),0x20,local_50);
        beltCFBStepD(resp + 1,local_68,pvVar1);
      }
      if (local_60 == (size_t *)0x0) {
        return 0;
      }
      local_68 = resp->rdf_len + 0x10;
    }
  }
  *local_60 = local_68;
  return 0;
}

Assistant:

err_t btokSMRespUnwrap(apdu_resp_t* resp, size_t* size, const octet apdu[],
	size_t count, void* state)
{
	size_t c1, c2;
	size_t rdf_len;
	const octet* rdf;
	const octet* mac;
	btok_sm_st* st;
	// pre
	ASSERT(memIsValid(apdu, count));
	ASSERT(memIsNullOrValid(state, btokSM_keep()));
	ASSERT(memIsNullOrValid(resp, sizeof(apdu_resp_t)));
	// слишком короткий ответ?
	if (count < 2 || state && count < 12)
		return ERR_BAD_APDU;
	// декодировать без снятия защиты?
	if (!state)
	{
		c1 = apduRespDec(resp, apdu, count);
		if (c1 == SIZE_MAX)
			return ERR_BAD_APDU;
		if (size)
		{
			ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
			ASSERT(resp == 0 ||
				memIsDisjoint2(size, O_PER_S, resp, apduRespSizeof(resp)));
			*size = c1;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(state, btokSM_keep(), apdu, count));
	// разобрать защищенное поле rdf: шифртекст
	c1 = derDec2(&rdf, &rdf_len, apdu, count - 2, 0x87);
	if (c1 != SIZE_MAX)
	{
		if (rdf_len < 2 || rdf[0] != 0x02)
			return ERR_BAD_APDU;
		++rdf, --rdf_len;
	}
	else
		c1 = rdf_len = 0;
	// разобрать защищенное поле rdf: имитовставка
	c2 = derDec3(&mac, apdu + c1, count - 2 - c1, 0x8E, 8);
	if (c2 == SIZE_MAX || c1 + c2 + 2 != count)
		return ERR_BAD_APDU;
	// ограничиться проверкой формата?
	if (!resp)
	{
		if (size)
		{
			ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
			*size = sizeof(apdu_resp_t) + rdf_len;
		}
		return ERR_OK;
	}
	// проверить счетчик
	st = (btok_sm_st*)state;
	if (st->ctr[0] % 2 != 0)
		return ERR_BAD_LOGIC;
	// проверить имитовставку
	beltMACStart(st->stack, st->key1, 32);
	beltMACStepA(st->ctr, 16, st->stack);
	beltMACStepA(apdu, c1, st->stack);
	beltMACStepA(apdu + count - 2, 2, st->stack);
	if (!beltMACStepV(mac, st->stack))
		return ERR_BAD_MAC;
	// заполнить поля ответа
	memSetZero(resp, sizeof(apdu_resp_t));
	resp->sw1 = apdu[count - 2], resp->sw2 = apdu[count - 1];
	resp->rdf_len = rdf_len;
	memCopy(resp->rdf, rdf, rdf_len);
	ASSERT(memIsDisjoint2(resp, apduRespSizeof(resp), state, btokSM_keep()));
	ASSERT(memIsDisjoint2(resp, apduRespSizeof(resp), apdu, count));
	// расшифровать rdf
	if (rdf_len)
	{
		beltCFBStart(st->stack, st->key2, 32, st->ctr);
		beltCFBStepD(resp->rdf, rdf_len, st->stack);
	}
	// возвратить размер
	if (size)
	{
		ASSERT(memIsDisjoint2(size, O_PER_S, state, btokSM_keep()));
		ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
		ASSERT(memIsDisjoint2(size, O_PER_S, resp, apduRespSizeof(resp)));
		*size = apduRespSizeof(resp);
	}
	// завершить
	return ERR_OK;
}